

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

uint32_t Predictor12_SSE2(uint32_t *left,uint32_t *top)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  
  uVar1 = *left;
  uVar2 = *top;
  uVar3 = top[-1];
  sVar4 = (((ushort)uVar2 & 0xff) + (ushort)(byte)uVar1) - (ushort)(byte)uVar3;
  sVar5 = ((ushort)(byte)(uVar2 >> 8) + (ushort)(byte)(uVar1 >> 8)) - (ushort)(byte)(uVar3 >> 8);
  sVar6 = ((ushort)(byte)(uVar2 >> 0x10) + (ushort)(byte)(uVar1 >> 0x10)) -
          (ushort)(byte)(uVar3 >> 0x10);
  sVar7 = ((ushort)(byte)(uVar2 >> 0x18) + (ushort)(byte)(uVar1 >> 0x18)) -
          (ushort)(byte)(uVar3 >> 0x18);
  return CONCAT13((0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)sVar5 - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * (char)sVar4 - (0xff < sVar4))));
}

Assistant:

static WEBP_INLINE uint32_t ClampedAddSubtractFull_SSE2(uint32_t c0,
                                                        uint32_t c1,
                                                        uint32_t c2) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i C0 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c0), zero);
  const __m128i C1 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c1), zero);
  const __m128i C2 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c2), zero);
  const __m128i V1 = _mm_add_epi16(C0, C1);
  const __m128i V2 = _mm_sub_epi16(V1, C2);
  const __m128i b = _mm_packus_epi16(V2, V2);
  return (uint32_t)_mm_cvtsi128_si32(b);
}